

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_reader_suite.cpp
# Opt level: O1

void number_suite::array_int_int(void)

{
  bool bVar1;
  chunk_reader reader;
  undefined4 local_164;
  view_type local_160;
  basic_reader<char> local_150;
  
  trial::protocol::json::basic_reader<char>::basic_reader(&local_150);
  local_160._M_len = 1;
  local_160._M_str = "[";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&local_150,&local_160);
  boost::detail::test_impl
            ("reader.next(\"[\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x70,"void number_suite::array_int_int()",bVar1);
  local_160._M_len = CONCAT44(local_160._M_len._4_4_,local_150.decoder.current.code);
  local_164 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x71,"void number_suite::array_int_int()",&local_160,&local_164);
  local_160._M_len = 1;
  local_160._M_str = "0";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&local_150,&local_160);
  boost::detail::test_impl
            ("!reader.next(\"0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x72,"void number_suite::array_int_int()",!bVar1);
  local_160._M_len = CONCAT44(local_160._M_len._4_4_,local_150.decoder.current.code);
  local_164 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x73,"void number_suite::array_int_int()",&local_160,&local_164);
  local_160._M_len = 3;
  local_160._M_str = "0,1";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&local_150,&local_160);
  boost::detail::test_impl
            ("reader.next(\"0,1\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x74,"void number_suite::array_int_int()",bVar1);
  local_160._M_len = CONCAT44(local_160._M_len._4_4_,local_150.decoder.current.code);
  local_164 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x75,"void number_suite::array_int_int()",&local_160,&local_164);
  local_160._M_len = 2;
  local_160._M_str = ",1";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&local_150,&local_160);
  boost::detail::test_impl
            ("!reader.next(\",1\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x76,"void number_suite::array_int_int()",!bVar1);
  local_160._M_len = CONCAT44(local_160._M_len._4_4_,local_150.decoder.current.code);
  local_164 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x77,"void number_suite::array_int_int()",&local_160,&local_164);
  local_160._M_len = 3;
  local_160._M_str = ",1]";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&local_150,&local_160);
  boost::detail::test_impl
            ("reader.next(\",1]\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x78,"void number_suite::array_int_int()",bVar1);
  local_160._M_len = CONCAT44(local_160._M_len._4_4_,local_150.decoder.current.code);
  local_164 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x79,"void number_suite::array_int_int()",&local_160,&local_164);
  local_160._M_len = 1;
  local_160._M_str = "]";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&local_150,&local_160);
  boost::detail::test_impl
            ("reader.next(\"]\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x7a,"void number_suite::array_int_int()",bVar1);
  local_160._M_len = CONCAT44(local_160._M_len._4_4_,local_150.decoder.current.code);
  local_164 = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x7b,"void number_suite::array_int_int()",&local_160,&local_164);
  if (local_150.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void array_int_int()
{
    // "[0,1]"
    json::chunk_reader reader;
    TRIAL_PROTOCOL_TEST(reader.next("["));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    TRIAL_PROTOCOL_TEST(!reader.next("0")); // Single zero is legal, but defer until next input
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array); // Retains old state
    TRIAL_PROTOCOL_TEST(reader.next("0,1"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST(!reader.next(",1"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer); // Retains old state
    TRIAL_PROTOCOL_TEST(reader.next(",1]"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST(reader.next("]"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
}